

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O3

void __thiscall
GameEngine::calculateCell
          (GameEngine *this,size_t posX,size_t posY,int32_t carnivore,int32_t herbivore)

{
  int32_t iVar1;
  shared_ptr<CellType> cell;
  CellType *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  getCell((GameEngine *)&stack0xffffffffffffffd8,(size_t)this,posX);
  if (local_28 != (CellType *)0x0) {
    iVar1 = CellType::getCarnivoreCount(local_28);
    CellType::setCarnivoreCount(local_28,iVar1 + carnivore);
    iVar1 = CellType::getHerbivoreCount(local_28);
    CellType::setHerbivoreCount(local_28,iVar1 + herbivore);
  }
  if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20._M_pi);
    return;
  }
  return;
}

Assistant:

void GameEngine::calculateCell(size_t posX, size_t posY, int32_t carnivore, int32_t herbivore) {
  auto cell = getCell(posX, posY);

  if (cell) {
    cell->setCarnivoreCount(cell->getCarnivoreCount() + carnivore);
    cell->setHerbivoreCount(cell->getHerbivoreCount() + herbivore);
  }
}